

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

int32_t __thiscall cppnet::TimerContainer::MinTime(TimerContainer *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  int *piVar4;
  int32_t local_24;
  int local_20;
  int32_t local_time;
  int32_t sub_time;
  uint32_t past_time;
  TimerContainer *this_local;
  
  local_time = 0;
  local_20 = 0;
  _sub_time = this;
  local_24 = LocalMinTime(this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_sub_timer);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_sub_timer);
    local_20 = (*(peVar3->super_Timer)._vptr_Timer[2])();
    peVar3 = std::
             __shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_sub_timer);
    iVar2 = (*(peVar3->super_Timer)._vptr_Timer[3])();
    local_time = iVar2 + local_time;
    if (0 < local_20) {
      local_24 = local_24 - local_time;
      if (0 < local_24) {
        piVar4 = std::min<int>(&local_24,&local_20);
        return *piVar4;
      }
      return local_20;
    }
    if (0 < local_24) {
      return local_24 - local_time;
    }
  }
  return local_24;
}

Assistant:

int32_t TimerContainer::MinTime() {
    uint32_t past_time = 0;
    int32_t sub_time = 0;
    int32_t local_time = LocalMinTime();

    if (_sub_timer) {
        sub_time = _sub_timer->MinTime();
        past_time += _sub_timer->CurrentTimer();

        if (sub_time > 0) {
            local_time = local_time - past_time;
            if (local_time > 0) {
                return std::min(local_time, sub_time);
            }
            return sub_time;

        } else if (local_time > 0){
            return local_time - past_time;
        }
    }

    return local_time;
}